

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall Arbitrarystring::Run(Arbitrarystring *this)

{
  pointer *this_00;
  size_type sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool local_69;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv;
  string v;
  Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> a;
  Arbitrarystring *this_local;
  
  this_00 = &vv.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testinator::
  Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  generate((Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this_00,1,0);
  testinator::
  Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shrink((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50,(output_type *)this_00);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
  local_69 = false;
  if (sVar1 == 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,0);
    lVar2 = std::__cxx11::string::size();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,1);
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    local_69 = lVar2 + lVar3 == lVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &vv.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_69;
}

Assistant:

DEF_TEST(string, Arbitrary)
{
  testinator::Arbitrary<string> a;
  string v = a.generate(1,0);
  vector<string> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}